

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

Variable __thiscall
LiteScript::_Type_CHARACTER::OMultiply(_Type_CHARACTER *this,Variable *obj1,Variable *obj2)

{
  Character *pCVar1;
  bool bVar2;
  uint uVar3;
  Object *pOVar4;
  Type *pTVar5;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *puVar6;
  Variable VVar7;
  Variable tmp;
  String local_58;
  Variable local_38;
  
  pOVar4 = Variable::operator->((Variable *)in_RCX);
  pTVar5 = Object::GetType(pOVar4);
  bVar2 = Type::operator!=(pTVar5,(Type *)_type_number);
  if (bVar2) {
    Variable::Convert(&local_38,in_RCX);
    pOVar4 = Variable::operator->(&local_38);
    pTVar5 = Object::GetType(pOVar4);
    bVar2 = Type::operator!=(pTVar5,(Type *)_type_number);
    if (bVar2) {
      pOVar4 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar4->memory);
    }
    else {
      pOVar4 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar4->memory);
      pOVar4 = Variable::operator->(obj2);
      pCVar1 = (Character *)pOVar4->data;
      pOVar4 = Variable::operator->(&local_38);
      uVar3 = Number::operator_cast_to_int((Number *)pOVar4->data);
      Character::operator*(&local_58,pCVar1,uVar3);
      pOVar4 = Variable::operator->((Variable *)this);
      String::operator=((String *)pOVar4->data,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_58.str._M_dataplus._M_p != &local_58.str.field_2) {
        operator_delete(local_58.str._M_dataplus._M_p);
      }
    }
    Variable::~Variable(&local_38);
    puVar6 = extraout_RDX_01;
  }
  else {
    pOVar4 = Variable::operator->(obj2);
    Memory::Create((Memory *)this,(Type *)pOVar4->memory);
    pOVar4 = Variable::operator->(obj2);
    pCVar1 = (Character *)pOVar4->data;
    pOVar4 = Variable::operator->((Variable *)in_RCX);
    uVar3 = Number::operator_cast_to_int((Number *)pOVar4->data);
    Character::operator*(&local_58,pCVar1,uVar3);
    pOVar4 = Variable::operator->((Variable *)this);
    String::operator=((String *)pOVar4->data,&local_58);
    puVar6 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_58.str._M_dataplus._M_p != &local_58.str.field_2) {
      operator_delete(local_58.str._M_dataplus._M_p);
      puVar6 = extraout_RDX_00;
    }
  }
  VVar7.nb_ref = puVar6;
  VVar7.obj = (Object *)this;
  return VVar7;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::OMultiply(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != Type::NUMBER) {
        Variable tmp = obj2.Convert(Type::NUMBER);
        if (tmp->GetType() != Type::NUMBER)
            return obj1->memory.Create(Type::NIL);
        Variable res = obj1->memory.Create(Type::STRING);
        res->GetData<String>() = obj1->GetData<Character>() * (unsigned int)(int)tmp->GetData<Number>();
        return res;
    }
    Variable res = obj1->memory.Create(Type::STRING);
    res->GetData<String>() = obj1->GetData<Character>() * (unsigned int)(int)obj2->GetData<Number>();
    return res;
}